

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O1

void __thiscall
SuiteDataDictionaryTests::TestaddFieldType::~TestaddFieldType(TestaddFieldType *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(addFieldType)
{
  DataDictionary object;
  TYPE::Type type;
  CHECK( !object.getFieldType( 14, type ) );
  CHECK( !object.getFieldType( 23, type ) );

  object.addFieldType( 14, TYPE::String );
  object.addFieldType( 23, TYPE::Char );

  CHECK( object.getFieldType( 14, type ) );
  CHECK_EQUAL( TYPE::String, type );
  CHECK( object.getFieldType( 23, type ) );
  CHECK_EQUAL( TYPE::Char, type );
}